

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O2

bool __thiscall
ParsePackage::_PackageVec
          (ParsePackage *this,char *buf,char *end,char type,int index,
          vector<cppnet::Any,_std::allocator<cppnet::Any>_> *vec)

{
  CPlaceHolder *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t sVar4;
  undefined7 in_register_00000009;
  Any *operand;
  Any *operand_00;
  Any *operand_01;
  Any *operand_02;
  Any *operand_03;
  Any *operand_04;
  int i_1;
  ulong uVar5;
  type_info *ptVar6;
  char *pcVar7;
  int i_5;
  char *pcVar8;
  int i_2;
  long lVar9;
  int i;
  size_type __n;
  reference rVar10;
  char *local_60;
  vector<bool,_std::allocator<bool>_> b_vec;
  
  iVar3 = (int)CONCAT71(in_register_00000009,type);
  switch(iVar3) {
  case 0x62:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      ptVar6 = (type_info *)CONCAT44(extraout_var,iVar3);
    }
    bVar2 = std::type_info::operator!=
                      ((type_info *)&std::vector<bool,std::allocator<bool>>::typeinfo,ptVar6);
    if (!bVar2) {
      cppnet::any_cast<std::vector<bool,std::allocator<bool>>>
                (&b_vec,(cppnet *)
                        ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>).
                         _M_impl.super__Vector_impl_data._M_start + index),operand);
      local_60 = (char *)CONCAT44(local_60._4_4_,
                                  ((int)b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                        _M_p -
                                  (int)b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p) * 8 +
                                  b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                  _M_offset);
      bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
      if (bVar2) {
        sVar4 = strlen(buf);
        pcVar8 = buf + sVar4;
        __n = 0;
        while( true ) {
          iVar3 = ((int)b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (int)b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                  b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_finish.super__Bit_iterator_base._M_offset;
          if ((long)iVar3 <= (long)__n) {
            std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                      (&b_vec.super__Bvector_base<std::allocator<bool>_>);
            return true;
          }
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&b_vec,__n);
          pcVar7 = "%d|";
          if (__n != iVar3 - 1) {
            pcVar7 = "%d,";
          }
          local_60 = (char *)CONCAT44(local_60._4_4_,(uint)((*rVar10._M_p & rVar10._M_mask) != 0));
          bVar2 = _SafeSprintf<int>(this,true,pcVar8,end,pcVar7,(int *)&local_60);
          if (!bVar2) break;
          sVar4 = strlen(pcVar8);
          pcVar8 = pcVar8 + sVar4;
          __n = __n + 1;
        }
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&b_vec.super__Bvector_base<std::allocator<bool>_>);
    }
    break;
  case 99:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      ptVar6 = (type_info *)CONCAT44(extraout_var_03,iVar3);
    }
    bVar2 = std::type_info::operator!=
                      ((type_info *)&std::vector<char,std::allocator<char>>::typeinfo,ptVar6);
    if (!bVar2) {
      cppnet::any_cast<std::vector<char,std::allocator<char>>>
                ((vector<char,_std::allocator<char>_> *)&b_vec,
                 (cppnet *)
                 ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                  super__Vector_impl_data._M_start + index),operand_02);
      local_60 = (char *)CONCAT44(local_60._4_4_,
                                  b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                  _M_offset -
                                  (int)b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p);
      bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
      if (bVar2) {
        sVar4 = strlen(buf);
        pcVar8 = buf + sVar4;
        uVar5 = 0;
        while( true ) {
          if ((long)(int)(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset -
                         (int)b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) <=
              (long)uVar5) {
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      ((_Vector_base<char,_std::allocator<char>_> *)&b_vec);
            return true;
          }
          pcVar7 = "%c,";
          if (uVar5 == (b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset -
                       (int)b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) - 1) {
            pcVar7 = "%c|";
          }
          bVar2 = _SafeSprintf<char&>(this,false,pcVar8,end,pcVar7,
                                      (char *)(CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p) + uVar5));
          if (!bVar2) break;
          sVar4 = strlen(pcVar8);
          pcVar8 = pcVar8 + sVar4;
          uVar5 = uVar5 + 1;
        }
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&b_vec);
    }
    break;
  case 100:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      ptVar6 = (type_info *)CONCAT44(extraout_var_02,iVar3);
    }
    bVar2 = std::type_info::operator!=
                      ((type_info *)&std::vector<double,std::allocator<double>>::typeinfo,ptVar6);
    if (!bVar2) {
      cppnet::any_cast<std::vector<double,std::allocator<double>>>
                ((vector<double,_std::allocator<double>_> *)&b_vec,
                 (cppnet *)
                 ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                  super__Vector_impl_data._M_start + index),operand_01);
      local_60 = (char *)CONCAT44(local_60._4_4_,
                                  (int)((ulong)(CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._12_4_,
                                                  b_vec.super__Bvector_base<std::allocator<bool>_>.
                                                  _M_impl.super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_offset) -
                                               CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p)) >> 3));
      bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
      if (bVar2) {
        sVar4 = strlen(buf);
        pcVar8 = buf + sVar4;
        lVar9 = 0;
        uVar5 = 0;
        while( true ) {
          iVar3 = (int)((ulong)(CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _12_4_,b_vec.super__Bvector_base<std::allocator<bool>_>.
                                                _M_impl.super__Bvector_impl_data._M_start.
                                                super__Bit_iterator_base._M_offset) -
                               CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p._4_4_,
                                        (int)b_vec.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p)) >> 3);
          if ((long)iVar3 <= (long)uVar5) {
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      ((_Vector_base<double,_std::allocator<double>_> *)&b_vec);
            return true;
          }
          pcVar7 = "%lld,";
          if (uVar5 == iVar3 - 1) {
            pcVar7 = "%lld|";
          }
          bVar2 = _SafeSprintf<double&>
                            (this,true,pcVar8,end,pcVar7,
                             (double *)
                             (CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p._4_4_,
                                       (int)b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl
                                            .super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p) + lVar9));
          if (!bVar2) break;
          sVar4 = strlen(pcVar8);
          pcVar8 = pcVar8 + sVar4;
          uVar5 = uVar5 + 1;
          lVar9 = lVar9 + 8;
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&b_vec);
    }
    break;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
    break;
  case 0x69:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      ptVar6 = (type_info *)CONCAT44(extraout_var_04,iVar3);
    }
    bVar2 = std::type_info::operator!=
                      ((type_info *)&std::vector<int,std::allocator<int>>::typeinfo,ptVar6);
    if (!bVar2) {
      cppnet::any_cast<std::vector<int,std::allocator<int>>>
                ((vector<int,_std::allocator<int>_> *)&b_vec,
                 (cppnet *)
                 ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                  super__Vector_impl_data._M_start + index),operand_03);
      local_60 = (char *)CONCAT44(local_60._4_4_,
                                  (int)((ulong)(CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._12_4_,
                                                  b_vec.super__Bvector_base<std::allocator<bool>_>.
                                                  _M_impl.super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_offset) -
                                               CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p)) >> 2));
      bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
      if (bVar2) {
        sVar4 = strlen(buf);
        pcVar8 = buf + sVar4;
        lVar9 = 0;
        uVar5 = 0;
        while( true ) {
          iVar3 = (int)((ulong)(CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _12_4_,b_vec.super__Bvector_base<std::allocator<bool>_>.
                                                _M_impl.super__Bvector_impl_data._M_start.
                                                super__Bit_iterator_base._M_offset) -
                               CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p._4_4_,
                                        (int)b_vec.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p)) >> 2);
          if ((long)iVar3 <= (long)uVar5) {
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&b_vec);
            return true;
          }
          pcVar7 = "%d,";
          if (uVar5 == iVar3 - 1) {
            pcVar7 = "%d|";
          }
          bVar2 = _SafeSprintf<int&>(this,false,pcVar8,end,pcVar7,
                                     (int *)(CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p) + lVar9));
          if (!bVar2) break;
          sVar4 = strlen(pcVar8);
          pcVar8 = pcVar8 + sVar4;
          uVar5 = uVar5 + 1;
          lVar9 = lVar9 + 4;
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&b_vec);
    }
    break;
  case 0x6c:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      ptVar6 = (type_info *)CONCAT44(extraout_var_01,iVar3);
    }
    bVar2 = std::type_info::operator!=
                      ((type_info *)&std::vector<long,std::allocator<long>>::typeinfo,ptVar6);
    if (!bVar2) {
      cppnet::any_cast<std::vector<long,std::allocator<long>>>
                ((vector<long,_std::allocator<long>_> *)&b_vec,
                 (cppnet *)
                 ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                  super__Vector_impl_data._M_start + index),operand_00);
      local_60 = (char *)CONCAT44(local_60._4_4_,
                                  (int)((ulong)(CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._12_4_,
                                                  b_vec.super__Bvector_base<std::allocator<bool>_>.
                                                  _M_impl.super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_offset) -
                                               CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p)) >> 3));
      bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
      if (bVar2) {
        sVar4 = strlen(buf);
        pcVar8 = buf + sVar4;
        lVar9 = 0;
        uVar5 = 0;
        while( true ) {
          iVar3 = (int)((ulong)(CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _12_4_,b_vec.super__Bvector_base<std::allocator<bool>_>.
                                                _M_impl.super__Bvector_impl_data._M_start.
                                                super__Bit_iterator_base._M_offset) -
                               CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p._4_4_,
                                        (int)b_vec.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p)) >> 3);
          if ((long)iVar3 <= (long)uVar5) {
            std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                      ((_Vector_base<long,_std::allocator<long>_> *)&b_vec);
            return true;
          }
          pcVar7 = "%ld,";
          if (uVar5 == iVar3 - 1) {
            pcVar7 = "%ld|";
          }
          bVar2 = _SafeSprintf<long&>(this,true,pcVar8,end,pcVar7,
                                      (long *)(CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p) + lVar9));
          if (!bVar2) break;
          sVar4 = strlen(pcVar8);
          pcVar8 = pcVar8 + sVar4;
          uVar5 = uVar5 + 1;
          lVar9 = lVar9 + 8;
        }
      }
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&b_vec);
    }
    break;
  default:
    if (iVar3 != 0x73) {
      return false;
    }
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      ptVar6 = (type_info *)&void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      ptVar6 = (type_info *)CONCAT44(extraout_var_00,iVar3);
    }
    bVar2 = std::type_info::operator!=
                      ((type_info *)
                       &std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        typeinfo,ptVar6);
    if (!bVar2) {
      cppnet::any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&b_vec,
                 (cppnet *)
                 ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                  super__Vector_impl_data._M_start + index),operand_04);
      local_60 = (char *)CONCAT44(local_60._4_4_,
                                  (int)((ulong)(CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._12_4_,
                                                  b_vec.super__Bvector_base<std::allocator<bool>_>.
                                                  _M_impl.super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_offset) -
                                               CONCAT44(b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)b_vec.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p)) >> 5));
      bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
      if (bVar2) {
        sVar4 = strlen(buf);
        pcVar8 = buf + sVar4;
        lVar9 = 0;
        uVar5 = 0;
        while( true ) {
          iVar3 = (int)((ulong)(CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _12_4_,b_vec.super__Bvector_base<std::allocator<bool>_>.
                                                _M_impl.super__Bvector_impl_data._M_start.
                                                super__Bit_iterator_base._M_offset) -
                               CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p._4_4_,
                                        (int)b_vec.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p)) >> 5);
          if ((long)iVar3 <= (long)uVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&b_vec);
            return true;
          }
          pcVar7 = "%s,";
          if (uVar5 == iVar3 - 1) {
            pcVar7 = "%s|";
          }
          local_60 = *(char **)(CONCAT44(b_vec.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p._4_4_,
                                         (int)b_vec.super__Bvector_base<std::allocator<bool>_>.
                                              _M_impl.super__Bvector_impl_data._M_start.
                                              super__Bit_iterator_base._M_p) + lVar9);
          bVar2 = _SafeSprintf<char_const*>(this,true,pcVar8,end,pcVar7,&local_60);
          if (!bVar2) break;
          sVar4 = strlen(pcVar8);
          pcVar8 = pcVar8 + sVar4;
          uVar5 = uVar5 + 1;
          lVar9 = lVar9 + 0x20;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&b_vec);
    }
  }
  return false;
}

Assistant:

bool ParsePackage::_PackageVec(char* buf, char* end, char type, int index, std::vector<cppnet::Any>& vec) {
    char* cur = buf;

    int cur_add = 0;
    int cur_len = 0;

    switch (type) {
    case 'i':
    {
        if (typeid(std::vector<int>) != vec[index].Type()) {
            return false;
        }
        std::vector<int> i_vec = cppnet::any_cast<std::vector<int>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)i_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)i_vec.size(); i++) {
            if (!_SafeSprintf(false, cur, end, ((i == (int)i_vec.size()-1) ? "%d|" : "%d,"), i_vec[i])) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 'c':
    {
        if (typeid(std::vector<char>) != vec[index].Type()) {
            return false;
        }
        std::vector<char> c_vec = cppnet::any_cast<std::vector<char>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)c_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)c_vec.size(); i++) {
            if (!_SafeSprintf(false, cur, end, ((i == (int)c_vec.size() - 1) ? "%c|" : "%c,"), c_vec[i])) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 's':
    {
        if (typeid(std::vector<std::string>) != vec[index].Type()) {
            return false;
        }
        std::vector<std::string> s_vec = cppnet::any_cast<std::vector<std::string>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)s_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)s_vec.size(); i++) {
            if (!_SafeSprintf(true, cur, end, ((i == (int)s_vec.size() - 1) ? "%s|" : "%s,"), s_vec[i].c_str())) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 'd':
    {
        if (typeid(std::vector<double>) != vec[index].Type()) {
            return false;
        }
        std::vector<double> d_vec = cppnet::any_cast<std::vector<double>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)d_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)d_vec.size(); i++) {
            if (!_SafeSprintf(true, cur, end, ((i == (int)d_vec.size() - 1) ? "%lld|" : "%lld,"), d_vec[i])) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 'l':
    {
        if (typeid(std::vector<long>) != vec[index].Type()) {
            return false;
        }
        std::vector<long> l_vec = cppnet::any_cast<std::vector<long>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)l_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)l_vec.size(); i++) {
            if (!_SafeSprintf(true, cur, end, ((i == (int)l_vec.size() - 1) ? "%ld|" : "%ld,"), l_vec[i])) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 'b':
    {
        if (typeid(std::vector<bool>) != vec[index].Type()) {
            return false;
        }
        std::vector<bool> b_vec = cppnet::any_cast<std::vector<bool>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)b_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)b_vec.size(); i++) {
            if (!_SafeSprintf(true, cur, end, ((i == (int)b_vec.size() - 1) ? "%d|" : "%d,"), b_vec[i]?1:0)) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    default:
        return false;
    }
    return true;;
}